

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::NewInnerFunction
          (ByteCodeWriter *this,RegSlot destinationRegister,uint index,RegSlot environmentRegister,
          bool isGenerator,RegSlot homeObjLocation)

{
  code *pcVar1;
  RegSlot RVar2;
  bool bVar3;
  RegSlot RVar4;
  RegSlot homeObj;
  undefined4 *puVar5;
  uint uVar6;
  OpCode opcode;
  int iVar7;
  uint32 local_50;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  uint local_40;
  RegSlot local_3c;
  int local_38;
  RegSlot local_34;
  
  local_40 = index;
  CheckOpen(this);
  if (destinationRegister != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      local_34 = homeObjLocation;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_008a2d3a;
      *puVar5 = 0;
      homeObjLocation = local_34;
    }
    RVar4 = FunctionBody::MapRegSlot(this->m_functionWrite,destinationRegister);
    if (environmentRegister != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        local_34 = homeObjLocation;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_008a2d3a;
        *puVar5 = 0;
        homeObjLocation = local_34;
      }
      local_34 = FunctionBody::MapRegSlot(this->m_functionWrite,environmentRegister);
      local_3c = RVar4;
      if (isGenerator) {
        iVar7 = (uint)(homeObjLocation != 0xffffffff) * 4 + 0x167;
      }
      else if (((this->m_functionWrite->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc)
               == Flags_None) {
        iVar7 = (uint)(homeObjLocation != 0xffffffff) * 4 + 0x166;
      }
      else {
        iVar7 = 0x168;
        if (homeObjLocation != 0xffffffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x934,"(!hasHomeObj)","!hasHomeObj");
          if (!bVar3) goto LAB_008a2d3a;
          *puVar5 = 0;
        }
      }
      opcode = (OpCode)iVar7;
      bVar3 = OpCodeAttr::HasMultiSizeLayout(opcode);
      uVar6 = local_40;
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x93b,"(OpCodeAttr::HasMultiSizeLayout(opcode))",
                                    "OpCodeAttr::HasMultiSizeLayout(opcode)");
        if (!bVar3) goto LAB_008a2d3a;
        *puVar5 = 0;
      }
      RVar2 = local_34;
      RVar4 = local_3c;
      if (homeObjLocation == 0xffffffff) {
        bVar3 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,opcode,local_3c,local_34,uVar6);
        if (bVar3) {
          return;
        }
        bVar3 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,opcode,RVar4,RVar2,uVar6);
        if (bVar3) {
          return;
        }
        local_4c = RVar4;
        local_48 = RVar2;
        local_50 = uVar6;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,opcode,this);
        uVar6 = 0xc;
      }
      else {
        if (this->m_functionWrite == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar3) goto LAB_008a2d3a;
          *puVar5 = 0;
        }
        homeObj = FunctionBody::MapRegSlot(this->m_functionWrite,homeObjLocation);
        RVar2 = local_34;
        RVar4 = local_3c;
        uVar6 = local_40;
        local_38 = iVar7;
        bVar3 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,opcode,local_3c,local_34,local_40,homeObj);
        if (bVar3) {
          return;
        }
        bVar3 = TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                          (this,(OpCode)local_38,RVar4,RVar2,uVar6,homeObj);
        if (bVar3) {
          return;
        }
        local_4c = RVar4;
        local_48 = RVar2;
        local_50 = uVar6;
        local_44 = homeObj;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_38,this);
        uVar6 = 0x10;
      }
      Data::Write(&this->m_byteCodeData,&local_50,uVar6);
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar5 = 0;
    Throw::InternalError();
  }
LAB_008a2d3a:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::NewInnerFunction(RegSlot destinationRegister, uint index, RegSlot environmentRegister, bool isGenerator, RegSlot homeObjLocation)
    {
        CheckOpen();

        bool hasHomeObj = homeObjLocation != Js::Constants::NoRegister;

        destinationRegister = ConsumeReg(destinationRegister);
        environmentRegister = ConsumeReg(environmentRegister);
        OpCode opcode = OpCode::NewInnerScFunc;
        if (isGenerator)
        {
            opcode = hasHomeObj ? OpCode::NewInnerScGenFuncHomeObj : OpCode::NewInnerScGenFunc;
        }
        else if (this->m_functionWrite->DoStackNestedFunc())
        {
            Assert(!hasHomeObj);
            opcode = OpCode::NewInnerStackScFunc;
        }
        else if (hasHomeObj)
        {
            opcode = OpCode::NewInnerScFuncHomeObj;
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(opcode));

        if (hasHomeObj)
        {
            homeObjLocation = ConsumeReg(homeObjLocation);
            MULTISIZE_LAYOUT_WRITE(ElementSlotI3, opcode, destinationRegister, environmentRegister, index, homeObjLocation);
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(ElementSlot, opcode, destinationRegister, environmentRegister, index);
        }
    }